

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O3

int __thiscall
QTextDocument::clone(QTextDocument *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  undefined8 uVar4;
  int iVar5;
  QTextDocument *this_00;
  QTextObject *this_01;
  QTextCursor *this_02;
  long in_FS_OFFSET;
  QTextCursor thisCursor;
  QTextCursor QStack_68;
  QTextCursor local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  this_00 = (QTextDocument *)operator_new(0x10);
  QTextDocument(this_00,(QObject *)__fn);
  iVar5 = QFragmentMapData<QTextFragmentData>::length
                    ((QFragmentMapData<QTextFragmentData> *)(*(long *)&this->field_0x8 + 0x158),0);
  if (iVar5 < 2) {
    local_60.d.d.ptr = (QSharedDataPointer<QTextCursorPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor(&local_60,this);
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::blockFormat((QTextCursor *)local_48);
    iVar5 = QTextFormat::type((QTextFormat *)local_48);
    if (iVar5 == 1) {
      iVar5 = QTextFormat::propertyCount((QTextFormat *)local_48);
      if (iVar5 != 0) {
        QTextCursor::QTextCursor((QTextCursor *)local_58,this_00);
        QTextCursor::setBlockFormat((QTextCursor *)local_58,(QTextBlockFormat *)local_48);
        QTextCursor::~QTextCursor((QTextCursor *)local_58);
      }
    }
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::blockCharFormat((QTextCursor *)local_58);
    iVar5 = QTextFormat::type((QTextFormat *)local_58);
    if (iVar5 == 2) {
      iVar5 = QTextFormat::propertyCount((QTextFormat *)local_58);
      if (iVar5 != 0) {
        QTextCursor::QTextCursor(&QStack_68,this_00);
        QTextCursor::setBlockCharFormat(&QStack_68,(QTextCharFormat *)local_58);
        QTextCursor::~QTextCursor(&QStack_68);
      }
    }
    QTextFormat::~QTextFormat((QTextFormat *)local_58);
    QTextFormat::~QTextFormat((QTextFormat *)local_48);
    this_02 = &local_60;
  }
  else {
    this_02 = (QTextCursor *)local_48;
    QTextCursor::QTextCursor(this_02,this_00);
    QTextDocumentFragment::QTextDocumentFragment((QTextDocumentFragment *)local_58,this);
    QTextCursor::insertFragment(this_02,(QTextDocumentFragment *)local_58);
    QTextDocumentFragment::~QTextDocumentFragment((QTextDocumentFragment *)local_58);
  }
  QTextCursor::~QTextCursor(this_02);
  this_01 = &QTextDocumentPrivate::rootFrame(*(QTextDocumentPrivate **)&this_00->field_0x8)->
             super_QTextObject;
  QTextDocumentPrivate::rootFrame(*(QTextDocumentPrivate **)&this->field_0x8);
  QTextFrame::frameFormat((QTextFrame *)local_48);
  QTextObject::setFormat(this_01,(QTextFormat *)local_48);
  QTextFormat::~QTextFormat((QTextFormat *)local_48);
  lVar2 = *(long *)&this_00->field_0x8;
  QString::operator=((QString *)(lVar2 + 0x2a8),(QString *)(lVar1 + 0x2a8));
  QString::operator=((QString *)(lVar2 + 0x2c0),(QString *)(lVar1 + 0x2c0));
  QString::operator=((QString *)(lVar2 + 0x2d8),(QString *)(lVar1 + 0x2d8));
  uVar4 = *(undefined8 *)(lVar1 + 0x2a0);
  *(undefined8 *)(lVar2 + 0x298) = *(undefined8 *)(lVar1 + 0x298);
  *(undefined8 *)(lVar2 + 0x2a0) = uVar4;
  *(undefined8 *)(lVar2 + 0x308) = *(undefined8 *)(lVar1 + 0x308);
  QTextOption::operator=((QTextOption *)(lVar2 + 0x1d0),(QTextOption *)(lVar1 + 0x1d0));
  QFont::QFont((QFont *)local_48,(QFont *)(lVar1 + 0x128));
  QTextFormatCollection::setDefaultFont((QTextFormatCollection *)(lVar2 + 0xe8),(QFont *)local_48);
  QFont::~QFont((QFont *)local_48);
  piVar3 = *(int **)(lVar1 + 0x180);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  local_48._0_8_ = ((totally_ordered_wrapper<QTextCursorPrivate_*> *)(lVar2 + 0x180))->ptr;
  *(int **)(lVar2 + 0x180) = piVar3;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QUrl,_QVariant,_std::less<QUrl>,_std::allocator<std::pair<const_QUrl,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<QUrl,_QVariant,_std::less<QUrl>,_std::allocator<std::pair<const_QUrl,_QVariant>_>_>_>_>
              *)local_48);
  QMap<QUrl,_QVariant>::clear((QMap<QUrl,_QVariant> *)(lVar2 + 0x188));
  std::function<QVariant_(const_QUrl_&)>::operator=
            ((function<QVariant_(const_QUrl_&)> *)(lVar2 + 400),
             (function<QVariant_(const_QUrl_&)> *)(lVar1 + 400));
  QString::operator=((QString *)(lVar2 + 0x1b0),(QString *)(lVar1 + 0x1b0));
  QArrayDataPointer<QCss::StyleRule>::operator=
            ((QArrayDataPointer<QCss::StyleRule> *)(lVar2 + 0x1f0),
             (QArrayDataPointer<QCss::StyleRule> *)(lVar1 + 0x1f0));
  QArrayDataPointer<QCss::MediaRule>::operator=
            ((QArrayDataPointer<QCss::MediaRule> *)(lVar2 + 0x208),
             (QArrayDataPointer<QCss::MediaRule> *)(lVar1 + 0x208));
  QArrayDataPointer<QCss::PageRule>::operator=
            ((QArrayDataPointer<QCss::PageRule> *)(lVar2 + 0x220),
             (QArrayDataPointer<QCss::PageRule> *)(lVar1 + 0x220));
  QArrayDataPointer<QCss::AnimationRule>::operator=
            ((QArrayDataPointer<QCss::AnimationRule> *)(lVar2 + 0x238),
             (QArrayDataPointer<QCss::AnimationRule> *)(lVar1 + 0x238));
  QArrayDataPointer<QCss::ImportRule>::operator=
            ((QArrayDataPointer<QCss::ImportRule> *)(lVar2 + 0x250),
             (QArrayDataPointer<QCss::ImportRule> *)(lVar1 + 0x250));
  *(undefined8 *)(lVar2 + 0x268) = *(undefined8 *)(lVar1 + 0x268);
  QMultiHash<QString,_QCss::StyleRule>::operator=
            ((QMultiHash<QString,_QCss::StyleRule> *)(lVar2 + 0x270),
             (QMultiHash<QString,_QCss::StyleRule> *)(lVar1 + 0x270));
  QMultiHash<QString,_QCss::StyleRule>::operator=
            ((QMultiHash<QString,_QCss::StyleRule> *)(lVar2 + 0x280),
             (QMultiHash<QString,_QCss::StyleRule> *)(lVar1 + 0x280));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (int)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QTextDocument *QTextDocument::clone(QObject *parent) const
{
    Q_D(const QTextDocument);
    QTextDocument *doc = new QTextDocument(parent);
    if (isEmpty()) {
        const QTextCursor thisCursor(const_cast<QTextDocument *>(this));

        const auto blockFormat = thisCursor.blockFormat();
        if (blockFormat.isValid() && !blockFormat.isEmpty())
            QTextCursor(doc).setBlockFormat(blockFormat);

        const auto blockCharFormat = thisCursor.blockCharFormat();
        if (blockCharFormat.isValid() && !blockCharFormat.isEmpty())
            QTextCursor(doc).setBlockCharFormat(blockCharFormat);
    } else {
        QTextCursor(doc).insertFragment(QTextDocumentFragment(this));
    }
    doc->rootFrame()->setFrameFormat(rootFrame()->frameFormat());
    QTextDocumentPrivate *priv = doc->d_func();
    priv->title = d->title;
    priv->url = d->url;
    priv->cssMedia = d->cssMedia;
    priv->pageSize = d->pageSize;
    priv->indentWidth = d->indentWidth;
    priv->defaultTextOption = d->defaultTextOption;
    priv->setDefaultFont(d->defaultFont());
    priv->resources = d->resources;
    priv->cachedResources.clear();
    priv->resourceProvider = d->resourceProvider;
#ifndef QT_NO_CSSPARSER
    priv->defaultStyleSheet = d->defaultStyleSheet;
    priv->parsedDefaultStyleSheet = d->parsedDefaultStyleSheet;
#endif
    return doc;
}